

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

XXH_errorcode XXH64_reset(XXH64_state_t *statePtr,unsigned_long_long seed)

{
  undefined1 local_70 [8];
  XXH64_state_t state;
  unsigned_long_long seed_local;
  XXH64_state_t *statePtr_local;
  
  state._80_8_ = seed;
  memset(local_70,0,0x50);
  state.total_len = state._80_8_ + 0x60ea27eeadc0b5d6;
  state.v1 = state._80_8_ + 0xc2b2ae3d27d4eb4f;
  state.v2 = state._80_8_;
  state.v3 = state._80_8_ + 0x61c8864e7a143579;
  memcpy(statePtr,local_70,0x58);
  return XXH_OK;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH64_reset(XXH64_state_t* statePtr, unsigned long long seed)
{
    XXH64_state_t state;   /* using a local state to memcpy() in order to avoid strict-aliasing warnings */
    memset(&state, 0, sizeof(state)-8);   /* do not write into reserved, for future removal */
    state.v1 = seed + PRIME64_1 + PRIME64_2;
    state.v2 = seed + PRIME64_2;
    state.v3 = seed + 0;
    state.v4 = seed - PRIME64_1;
    memcpy(statePtr, &state, sizeof(state));
    return XXH_OK;
}